

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.cpp
# Opt level: O2

TreeEnsembleParameters_TreeNode * __thiscall
CoreML::TreeEnsembleBase::_getNode
          (TreeEnsembleBase *this,size_t treeId,size_t nodeId,bool is_setup_routine)

{
  iterator __pos;
  Type *pTVar1;
  ostream *poVar2;
  logic_error *plVar3;
  string asStack_1c8 [32];
  ostringstream ss;
  
  _ss = treeId;
  __pos = std::
          _Rb_tree<std::pair<unsigned_long,_unsigned_long>,_std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>,_std::_Select1st<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>_>,_std::less<std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_unsigned_long>,_int>_>_>
          ::lower_bound(&(this->_nodeId_map)._M_t,(key_type *)&ss);
  if ((((_Rb_tree_header *)__pos._M_node == &(this->_nodeId_map)._M_t._M_impl.super__Rb_tree_header)
      || (*(size_t *)(__pos._M_node + 1) != treeId)) ||
     (__pos._M_node[1]._M_parent != (_Base_ptr)nodeId)) {
    if (!is_setup_routine) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar2 = std::operator<<((ostream *)&ss,"Setup routine not called yet for node with treeId=");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,", nodeID=");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,".");
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::logic_error::logic_error(plVar3,asStack_1c8);
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pTVar1 = google::protobuf::
             RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::Add
                       (&this->tree_parameters->nodes_);
    pTVar1->treeid_ = treeId;
    pTVar1->nodeid_ = nodeId;
    _ss = treeId;
    std::
    _Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Select1st<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>,std::less<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>>
    ::_M_insert_unique_<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>
              ((_Rb_tree<std::pair<unsigned_long,unsigned_long>,std::pair<std::pair<unsigned_long,unsigned_long>const,int>,std::_Select1st<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>,std::less<std::pair<unsigned_long,unsigned_long>>,std::allocator<std::pair<std::pair<unsigned_long,unsigned_long>const,int>>>
                *)&this->_nodeId_map,(const_iterator)__pos._M_node,
               (pair<const_std::pair<unsigned_long,_unsigned_long>,_int> *)&ss);
  }
  else {
    if (is_setup_routine) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
      poVar2 = std::operator<<((ostream *)&ss,"Setup routine called multiple times for treeId=");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,", nodeID=");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,".");
      plVar3 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::logic_error::logic_error(plVar3,asStack_1c8);
      __cxa_throw(plVar3,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
             Mutable<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                       (&(this->tree_parameters->nodes_).super_RepeatedPtrFieldBase,
                        *(int *)&__pos._M_node[1]._M_left);
  }
  return pTVar1;
}

Assistant:

Specification::TreeEnsembleParameters_TreeNode& TreeEnsembleBase::_getNode(size_t treeId, size_t nodeId, bool is_setup_routine) {
        auto it = _nodeId_map.lower_bound({treeId, nodeId});

        if(it == _nodeId_map.end() || it->first != std::make_pair(treeId, nodeId)) {
            if(!is_setup_routine) {
                std::ostringstream ss;
                ss << "Setup routine not called yet for node with treeId=" << treeId << ", nodeID=" << nodeId << ".";
                throw std::logic_error(ss.str());
            }

            int new_node_index = tree_parameters->nodes_size();
            Specification::TreeEnsembleParameters_TreeNode* newNode = tree_parameters->add_nodes();
            newNode->set_treeid(treeId);
            newNode->set_nodeid(nodeId);
            _nodeId_map.insert(it, {{treeId, nodeId}, new_node_index});
            return *newNode;
        } else {
            if(is_setup_routine) {
                std::ostringstream ss;
                ss << "Setup routine called multiple times for treeId=" << treeId << ", nodeID=" << nodeId << ".";
                throw std::logic_error(ss.str());
            }
            return *(tree_parameters->mutable_nodes(it->second));
        }
    }